

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_persistence_representations.h
# Opt level: O2

bool Gudhi::Persistence_representations::compare_points_sorting
               (pair<double,_double> f,pair<double,_double> s)

{
  bool bVar1;
  
  bVar1 = true;
  if (s.first <= f.first) {
    if (f.first <= s.first) {
      return s.second < f.second;
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool compare_points_sorting(std::pair<double, double> f, std::pair<double, double> s) {
  if (f.first < s.first) {
    return true;
  } else {  // f.first >= s.first
    if (f.first > s.first) {
      return false;
    } else {  // f.first == s.first
      if (f.second > s.second) {
        return true;
      } else {
        return false;
      }
    }
  }
}